

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

void __thiscall
sisl::array_n<float,_1,_std::allocator<float>_>::array_n
          (array_n<float,_1,_std::allocator<float>_> *this,uint d0,...)

{
  float *__s;
  ulong __n;
  va_list vl;
  
  this->_dims[0] = d0;
  if (d0 == 0) {
    __s = (float *)0x0;
  }
  else {
    __n = (ulong)d0;
    __s = __gnu_cxx::new_allocator<float>::allocate((new_allocator<float> *)this,__n,(void *)0x0);
    this->first = __s;
    memset(__s,0,__n * 4);
    this->last = __s + __n;
  }
  this->_array = __s;
  return;
}

Assistant:

array_n(unsigned int d0, ...) {
            unsigned int n = d0;
            size_type i;

            // Start with d0
            va_list vl;
            va_start(vl, d0);

            _dims[0] = d0;

            for(int i = 1; i < N; i++) {
                _dims[i] = va_arg(vl, unsigned int);
                n *= _dims[i];
            }
            va_end(vl);
            _alloc(n);
#ifdef SISL_CL
            _onDevice = false;
            _deviceMemory = nullptr;
#endif
        }